

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_scatterplot.cpp
# Opt level: O0

Reals Omega_h::get_linear_scatter_coords<3>(Reals *coords,Vector<3> direction,Vector<3> origin)

{
  double dVar1;
  int size_in;
  void *extraout_RDX;
  Read<double> *in_RSI;
  Reals RVar2;
  Write<double> local_1f0;
  undefined1 local_1e0 [8];
  type_conflict1 f;
  allocator local_189;
  string local_188 [32];
  undefined1 local_168 [8];
  Write<double> coords_1d_w;
  int n;
  Real offset;
  Reals *coords_local;
  ulong local_90;
  double local_88 [6];
  int local_54;
  double dStack_50;
  Int i;
  double out;
  double *local_40;
  int local_34;
  double *local_30;
  undefined4 local_24;
  double *local_20;
  undefined4 local_14;
  double *local_10;
  
  local_88[3] = direction.super_Few<double,_3>.array_[0];
  local_88[4] = direction.super_Few<double,_3>.array_[1];
  local_88[5] = direction.super_Few<double,_3>.array_[2];
  local_88[0] = origin.super_Few<double,_3>.array_[0];
  local_88[1] = origin.super_Few<double,_3>.array_[1];
  local_88[2] = origin.super_Few<double,_3>.array_[2];
  local_10 = local_88;
  local_14 = 0;
  local_20 = local_88 + 3;
  local_24 = 0;
  dStack_50 = origin.super_Few<double,_3>.array_[0] * direction.super_Few<double,_3>.array_[0];
  for (local_54 = 1; dVar1 = dStack_50, local_54 < 3; local_54 = local_54 + 1) {
    local_34 = local_54;
    local_30 = local_88;
    out._4_4_ = local_54;
    local_40 = local_88 + 3;
    dStack_50 = local_30[local_54] * local_40[local_54] + dStack_50;
  }
  if (((ulong)(in_RSI->write_).shared_alloc_.alloc & 1) == 0) {
    local_90 = ((in_RSI->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_90 = (ulong)(in_RSI->write_).shared_alloc_.alloc >> 3;
  }
  size_in = divide_no_remainder<int>((int)(local_90 >> 3),3);
  coords_1d_w.shared_alloc_.direct_ptr._4_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"",&local_189);
  Write<double>::Write((Write<double> *)local_168,size_in,(string *)local_188);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  Read<double>::Read((Read<double> *)local_1e0,in_RSI);
  f.direction.super_Few<double,_3>.array_[1] = direction.super_Few<double,_3>.array_[2];
  f.coords.write_.shared_alloc_.direct_ptr = (void *)direction.super_Few<double,_3>.array_[0];
  f.direction.super_Few<double,_3>.array_[0] = direction.super_Few<double,_3>.array_[1];
  f.direction.super_Few<double,_3>.array_[2] = dVar1;
  Write<double>::Write((Write<double> *)&f.offset,(Write<double> *)local_168);
  parallel_for<Omega_h::get_linear_scatter_coords<3>(Omega_h::Read<double>,Omega_h::Vector<3>,Omega_h::Vector<3>)::_lambda(int)_1_&>
            (coords_1d_w.shared_alloc_.direct_ptr._4_4_,(type_conflict1 *)local_1e0);
  Write<double>::Write(&local_1f0,(Write<signed_char> *)local_168);
  Read<double>::Read(coords,&local_1f0);
  Write<double>::~Write(&local_1f0);
  get_linear_scatter_coords<3>(Omega_h::Read<double>,Omega_h::Vector<3>,Omega_h::Vector<3>)::
  {lambda(int)#1}::~Vector((_lambda_int__1_ *)local_1e0);
  Write<double>::~Write((Write<double> *)local_168);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)coords;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals get_linear_scatter_coords(
    Reals coords, Vector<dim> direction, Vector<dim> origin) {
  auto offset = origin * direction;
  auto n = divide_no_remainder(coords.size(), dim);
  auto coords_1d_w = Write<Real>(n);
  auto f = OMEGA_H_LAMBDA(LO i) {
    auto x = get_vector<dim>(coords, i);
    auto d = x * direction - offset;
    coords_1d_w[i] = d;
  };
  parallel_for(n, f);
  return coords_1d_w;
}